

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReduceMeanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reducemean(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x500) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x500;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.reducemean_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ReduceMeanLayerParams>
                   (arena);
    (this->layer_).reducemean_ = (ReduceMeanLayerParams *)LVar2;
  }
  return (ReduceMeanLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMeanLayerParams* NeuralNetworkLayer::_internal_mutable_reducemean() {
  if (!_internal_has_reducemean()) {
    clear_layer();
    set_has_reducemean();
    layer_.reducemean_ = CreateMaybeMessage< ::CoreML::Specification::ReduceMeanLayerParams >(GetArenaForAllocation());
  }
  return layer_.reducemean_;
}